

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTime.c
# Opt level: O0

char * strtime_m(void)

{
  tm *__tp;
  size_t sVar1;
  tm *timeptr;
  time_t t;
  
  memset(strftime_m_tmpbuf,0,0x40);
  time((time_t *)&timeptr);
  __tp = localtime((time_t *)&timeptr);
  if ((__tp != (tm *)0x0) &&
     (sVar1 = strftime(strftime_m_tmpbuf,0x40,"%Y-%m-%d %H:%M:%S",__tp), sVar1 == 0)) {
    memset(strftime_m_tmpbuf,0,0x40);
  }
  return strftime_m_tmpbuf;
}

Assistant:

char* strtime_m(void)
{
#ifndef WINCE
	time_t t;
	struct tm *timeptr = NULL;

	memset(strftime_m_tmpbuf, 0, sizeof(strftime_m_tmpbuf));

	time(&t);
	timeptr = localtime(&t);

	if (timeptr == NULL)
	{
		return strftime_m_tmpbuf;
	}

	// Use strftime to build a customized time string. 
	if (strftime(
		strftime_m_tmpbuf,
		sizeof(strftime_m_tmpbuf),
		"%Y-%m-%d %H:%M:%S",
		timeptr
		) <= 0)
	{
		memset(strftime_m_tmpbuf, 0, sizeof(strftime_m_tmpbuf));
		return strftime_m_tmpbuf;
	}
#else
	int nb = 0;
	TCHAR* tstr = (TCHAR*)calloc(sizeof(strftime_m_tmpbuf), sizeof(TCHAR));

	memset(strftime_m_tmpbuf, 0, sizeof(strftime_m_tmpbuf));

	if (tstr == NULL)
	{
		return strftime_m_tmpbuf;
	}

	memset(tstr, 0, sizeof(strftime_m_tmpbuf)*sizeof(TCHAR));

	// Use GetDateFormat() and GetTimeFormat() to build a customized time string. 
	nb = GetDateFormat(
		MAKELCID(MAKELANGID(LANG_ENGLISH, SUBLANG_ENGLISH_US), SORT_DEFAULT), // Locale.
		0, // Flags.
		NULL, // Current local system date.
		_T("yyyy'-'MM'-'dd' '"), // Format the string. 
		tstr, 
		sizeof(strftime_m_tmpbuf)
		);
	if (nb <= 0)
	{
		free(tstr); tstr = NULL;
		return strftime_m_tmpbuf;
	}

	if (GetTimeFormat(
		MAKELCID(MAKELANGID(LANG_ENGLISH, SUBLANG_ENGLISH_US), SORT_DEFAULT), // Locale.
		0, // Flags.
		NULL, // Current local system time.
		_T("HH':'mm':'ss"), // Format the string. 
		tstr+(nb-1), 
		sizeof(strftime_m_tmpbuf)-(nb-1)
		) <= 0)
	{
		free(tstr); tstr = NULL;
		return strftime_m_tmpbuf;
	}

#ifdef UNICODE
	wcstombs(strftime_m_tmpbuf, tstr, sizeof(strftime_m_tmpbuf));
#else
	memcpy(strftime_m_tmpbuf, tstr, sizeof(strftime_m_tmpbuf));
#endif // UNICODE
	strftime_m_tmpbuf[sizeof(strftime_m_tmpbuf)-1] = 0;
	free(tstr); tstr = NULL;
#endif // !WINCE

	return strftime_m_tmpbuf;
}